

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

void Saig_SynchSetConstant1(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  pvVar1 = Vec_PtrEntry(vSimInfo,pAig->pConst1->Id);
  uVar2 = 0;
  uVar3 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    *(undefined4 *)((long)pvVar1 + uVar2 * 4) = 0x55555555;
  }
  return;
}

Assistant:

void Saig_SynchSetConstant1( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int w;
    pObj = Aig_ManConst1( pAig );
    pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
    for ( w = 0; w < nWords; w++ )
        pSim[w] = 0x55555555;
}